

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::SectionTracking::TestCaseTracker::enterSection(TestCaseTracker *this,string *name)

{
  RunState RVar1;
  TrackedSection *this_00;
  TrackedSection *child;
  string *name_local;
  TestCaseTracker *this_local;
  
  this_00 = TrackedSection::acquireChild(this->m_currentSection,name);
  if (((this->m_completedASectionThisRun & 1U) == 0) &&
     (RVar1 = TrackedSection::runState(this_00), RVar1 != Completed)) {
    this->m_currentSection = this_00;
    TrackedSection::enter(this->m_currentSection);
    return true;
  }
  return false;
}

Assistant:

bool enterSection( std::string const& name ) {
            TrackedSection* child = m_currentSection->acquireChild( name );
            if( m_completedASectionThisRun || child->runState() == TrackedSection::Completed )
                return false;

            m_currentSection = child;
            m_currentSection->enter();
            return true;
        }